

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int createFunctionApi(sqlite3 *db,char *zFunc,int nArg,int enc,void *p,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,_func_void_sqlite3_context_ptr *xValue,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xInverse,
                     _func_void_void_ptr *xDestroy)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  sqlite3_value **extraout_RDX;
  sqlite3_value **extraout_RDX_00;
  char *in_RSI;
  sqlite3 *in_RDI;
  sqlite3_context *in_R8;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_R9;
  sqlite3 *in_stack_00000008;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_stack_00000010;
  _func_void_sqlite3_context_ptr *in_stack_00000018;
  _func_void_sqlite3_context_ptr *in_stack_00000020;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_stack_00000028;
  FuncDestructor *pArg;
  int rc;
  sqlite3 *in_stack_ffffffffffffff88;
  sqlite3 *in_stack_ffffffffffffff90;
  int *local_48;
  char *zFunctionName;
  
  local_48 = (int *)0x0;
  zFunctionName = in_RSI;
  sqlite3_mutex_enter((sqlite3_mutex *)0x14b61a);
  iVar1 = (int)in_RSI;
  if (in_stack_00000028 != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
    local_48 = (int *)sqlite3Malloc((u64)in_stack_ffffffffffffff90);
    if (local_48 == (int *)0x0) {
      sqlite3OomFault(in_stack_ffffffffffffff90);
      (*in_stack_00000028)(in_R8,iVar1,extraout_RDX);
      goto LAB_0014b713;
    }
    *local_48 = 0;
    *(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)(local_48 + 2) = in_stack_00000028
    ;
    *(sqlite3_context **)(local_48 + 4) = in_R8;
  }
  iVar1 = (int)zFunctionName;
  sqlite3CreateFunc(in_RDI,zFunctionName,in_EDX,in_ECX,in_R8,in_R9,in_stack_00000010,
                    in_stack_00000018,in_stack_00000020,in_stack_00000028,pArg);
  in_stack_ffffffffffffff88 = in_stack_00000008;
  if ((local_48 != (int *)0x0) && (*local_48 == 0)) {
    (*in_stack_00000028)(in_R8,iVar1,extraout_RDX_00);
    sqlite3_free((void *)0x14b711);
    in_stack_ffffffffffffff88 = in_stack_00000008;
  }
LAB_0014b713:
  iVar1 = sqlite3ApiExit(in_stack_ffffffffffffff88,0);
  sqlite3_mutex_leave((sqlite3_mutex *)0x14b733);
  return iVar1;
}

Assistant:

static int createFunctionApi(
  sqlite3 *db,
  const char *zFunc,
  int nArg,
  int enc,
  void *p,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**),
  void (*xStep)(sqlite3_context*,int,sqlite3_value**),
  void (*xFinal)(sqlite3_context*),
  void (*xValue)(sqlite3_context*),
  void (*xInverse)(sqlite3_context*,int,sqlite3_value**),
  void(*xDestroy)(void*)
){
  int rc = SQLITE_ERROR;
  FuncDestructor *pArg = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( xDestroy ){
    pArg = (FuncDestructor *)sqlite3Malloc(sizeof(FuncDestructor));
    if( !pArg ){
      sqlite3OomFault(db);
      xDestroy(p);
      goto out;
    }
    pArg->nRef = 0;
    pArg->xDestroy = xDestroy;
    pArg->pUserData = p;
  }
  rc = sqlite3CreateFunc(db, zFunc, nArg, enc, p,
      xSFunc, xStep, xFinal, xValue, xInverse, pArg
  );
  if( pArg && pArg->nRef==0 ){
    assert( rc!=SQLITE_OK || (xStep==0 && xFinal==0) );
    xDestroy(p);
    sqlite3_free(pArg);
  }

 out:
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}